

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object_State_Header.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Object_State_Header::Encode(Object_State_Header *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Object_State_Header *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar1 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_ObjID);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_RefObjID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16UpdateNum);
  KDataStream::operator<<(pKVar1,this->m_ui8ForceID);
  return;
}

Assistant:

void Object_State_Header::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_ObjID
           << KDIS_STREAM m_RefObjID
           << m_ui16UpdateNum
           << m_ui8ForceID;
}